

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
tl::Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::grow
          (Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *this,size_t capacity)

{
  u64 capacity_00;
  size_t n;
  size_t capacity_local;
  Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *this_local;
  
  if (capacity < 0x41) {
    reserve(this,0x40);
  }
  else if (capacity < 0x101) {
    reserve(this,0x100);
  }
  else {
    capacity_00 = nextPowerOf2(capacity);
    reserve(this,capacity_00);
  }
  return;
}

Assistant:

void Vector<T>::grow(size_t capacity)noexcept
{
    if(capacity <= 64) {
        reserve(64);
    }
    else if(capacity <= 256) {
        reserve(256);
    }
    else {
       const size_t n = nextPowerOf2(capacity);
       reserve(n);
    }
}